

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_huff_decode(stbi__jpeg *j,stbi__huffman *h)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int local_2c;
  int s;
  int k;
  int c;
  uint temp;
  stbi__huffman *h_local;
  stbi__jpeg *j_local;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar2 = (uint)h->fast[(int)(j->code_buffer >> 0x17)];
  if (uVar2 < 0xff) {
    bVar1 = h->size[(int)uVar2];
    if (j->code_bits < (int)(uint)bVar1) {
      j_local._4_4_ = 0xffffffff;
    }
    else {
      j->code_buffer = j->code_buffer << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
      j_local._4_4_ = (uint)h->values[(int)uVar2];
    }
  }
  else {
    for (local_2c = 10; h->maxcode[local_2c] <= j->code_buffer >> 0x10; local_2c = local_2c + 1) {
    }
    if (local_2c == 0x11) {
      j->code_bits = j->code_bits + -0x10;
      j_local._4_4_ = 0xffffffff;
    }
    else if (j->code_bits < local_2c) {
      j_local._4_4_ = 0xffffffff;
    }
    else {
      iVar3 = (j->code_buffer >> (0x20 - (byte)local_2c & 0x1f) & stbi__bmask[local_2c]) +
              h->delta[local_2c];
      if ((j->code_buffer >> (0x20 - h->size[iVar3] & 0x1f) & stbi__bmask[h->size[iVar3]]) !=
          (uint)h->code[iVar3]) {
        __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/include/stb/stb_image.h"
                      ,0x673,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
      }
      j->code_bits = j->code_bits - local_2c;
      j->code_buffer = j->code_buffer << ((byte)local_2c & 0x1f);
      j_local._4_4_ = (uint)h->values[iVar3];
    }
  }
  return j_local._4_4_;
}

Assistant:

stbi_inline static int stbi__jpeg_huff_decode(stbi__jpeg *j, stbi__huffman *h)
{
   unsigned int temp;
   int c,k;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   // look at the top FAST_BITS and determine what symbol ID it is,
   // if the code is <= FAST_BITS
   c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
   k = h->fast[c];
   if (k < 255) {
      int s = h->size[k];
      if (s > j->code_bits)
         return -1;
      j->code_buffer <<= s;
      j->code_bits -= s;
      return h->values[k];
   }

   // naive test is to shift the code_buffer down so k bits are
   // valid, then test against maxcode. To speed this up, we've
   // preshifted maxcode left so that it has (16-k) 0s at the
   // end; in other words, regardless of the number of bits, it
   // wants to be compared against something shifted to have 16;
   // that way we don't need to shift inside the loop.
   temp = j->code_buffer >> 16;
   for (k=FAST_BITS+1 ; ; ++k)
      if (temp < h->maxcode[k])
         break;
   if (k == 17) {
      // error! code not found
      j->code_bits -= 16;
      return -1;
   }

   if (k > j->code_bits)
      return -1;

   // convert the huffman code to the symbol id
   c = ((j->code_buffer >> (32 - k)) & stbi__bmask[k]) + h->delta[k];
   STBI_ASSERT((((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]);

   // convert the id to a symbol
   j->code_bits -= k;
   j->code_buffer <<= k;
   return h->values[c];
}